

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::renderNormalBuffer(SceneRender *this,Uniforms *_uniforms)

{
  Model *this_00;
  Shader *pSVar1;
  bool bVar2;
  int iVar3;
  mat4 *pmVar4;
  vec3 *pvVar5;
  vec3 *v2;
  mat4 *m2;
  pointer ppVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *psVar7;
  socklen_t in_ECX;
  sockaddr *__addr;
  vec<3,_float,_(glm::qualifier)0> vVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  mat<4,_4,_float,_(glm::qualifier)0> local_39c;
  allocator local_359;
  string local_358;
  vec3 local_338;
  vec3 local_328;
  allocator local_319;
  string local_318;
  mat<4,_4,_float,_(glm::qualifier)0> local_2f4;
  mat<4,_4,_float,_(glm::qualifier)0> local_2b4;
  allocator local_271;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  allocator local_229;
  string local_228;
  _Self local_208;
  _Self local_200;
  iterator it;
  string local_1f0;
  mat<4,_4,_float,_(glm::qualifier)0> local_1cc;
  allocator local_189;
  string local_188;
  vec3 local_168;
  vec3 local_158;
  allocator local_149;
  string local_148;
  mat<4,_4,_float,_(glm::qualifier)0> local_124;
  mat<4,_4,_float,_(glm::qualifier)0> local_e4;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  Shader *local_20;
  Shader *normalShader;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  normalShader = (Shader *)_uniforms;
  _uniforms_local = (Uniforms *)this;
  bVar2 = vera::Fbo::isAllocated(&this->normalFbo);
  if (bVar2) {
    vera::Fbo::bind(&this->normalFbo,(int)_uniforms,__addr,in_ECX);
    if ((this->m_depth_test & 1U) != 0) {
      glEnable(0xb71);
    }
    if (((*(byte *)(*(long *)&normalShader[1].m_vertexShader + 0x20) & 1) != 0) ||
       (((this->m_origin).bChange & 1U) != 0)) {
      vera::setCamera(*(Camera **)&normalShader[1].m_vertexShader);
      pmVar4 = vera::Node::getTransformMatrix(&this->m_origin);
      vera::applyMatrix(pmVar4);
    }
    local_20 = (Shader *)0x0;
    if (-1 < this->m_floor_subd_target) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"normal",&local_41);
      local_20 = vera::Model::getBufferShader(&this->m_floor,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_20 != (Shader *)0x0) {
        bVar2 = Tracker::isRunning((Tracker *)((long)&normalShader[3].m_vertexSource.field_2 + 8));
        if (bVar2) {
          pSVar1 = normalShader + 3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_78,"render:sceneNormal:floor",&local_79);
          Tracker::begin((Tracker *)((long)&(pSVar1->m_vertexSource).field_2 + 8),&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        vera::Shader::use(local_20);
        (*(normalShader->super_HaveDefines)._vptr_HaveDefines[0x3e])(normalShader,local_20,0);
        pSVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a0,"u_modelViewProjectionMatrix",&local_a1);
        vera::getProjectionViewWorldMatrix();
        pmVar4 = vera::Node::getTransformMatrix(&(this->m_floor).super_Node);
        glm::operator*(&local_e4,&local_124,pmVar4);
        vera::Shader::setUniform(pSVar1,&local_a0,&local_e4,false);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        pSVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_148,"u_model",&local_149);
        pvVar5 = vera::Node::getPosition(&this->m_origin);
        v2 = vera::Node::getPosition(&(this->m_floor).super_Node);
        vVar8 = glm::operator+(pvVar5,v2);
        local_168.field_2 = vVar8.field_2;
        local_168._0_8_ = vVar8._0_8_;
        local_158._0_8_ = local_168._0_8_;
        local_158.field_2 = local_168.field_2;
        vera::Shader::setUniform(pSVar1,&local_148,&local_158);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        pSVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_188,"u_modelMatrix",&local_189);
        pmVar4 = vera::Node::getTransformMatrix(&this->m_origin);
        m2 = vera::Node::getTransformMatrix(&(this->m_floor).super_Node);
        glm::operator*(&local_1cc,pmVar4,m2);
        vera::Shader::setUniform(pSVar1,&local_188,&local_1cc,false);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
        vera::Model::render(&this->m_floor,local_20);
        bVar2 = Tracker::isRunning((Tracker *)((long)&normalShader[3].m_vertexSource.field_2 + 8));
        if (bVar2) {
          pSVar1 = normalShader + 3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1f0,"render:sceneNormal:floor",
                     (allocator *)((long)&it._M_node + 7));
          Tracker::end((Tracker *)((long)&(pSVar1->m_vertexSource).field_2 + 8),&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
        }
      }
    }
    vera::cullingMode(this->m_culling);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                  *)&normalShader[1].super_HaveDefines.m_defines._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_right);
    while( true ) {
      local_208._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                  *)&normalShader[1].super_HaveDefines.m_defines._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_right);
      bVar2 = std::operator!=(&local_200,&local_208);
      if (!bVar2) break;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_200);
      this_00 = ppVar6->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_228,"normal",&local_229);
      local_20 = vera::Model::getBufferShader(this_00,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if (local_20 != (Shader *)0x0) {
        bVar2 = Tracker::isRunning((Tracker *)((long)&normalShader[3].m_vertexSource.field_2 + 8));
        if (bVar2) {
          pSVar1 = normalShader + 3;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                   ::operator->(&local_200);
          psVar7 = vera::Model::getName_abi_cxx11_(ppVar6->second);
          std::operator+(&local_250,"render:sceneNormal:",psVar7);
          Tracker::begin((Tracker *)((long)&(pSVar1->m_vertexSource).field_2 + 8),&local_250);
          std::__cxx11::string::~string((string *)&local_250);
        }
        vera::Shader::use(local_20);
        (*(normalShader->super_HaveDefines)._vptr_HaveDefines[0x3e])(normalShader,local_20,0);
        pSVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_270,"u_modelViewProjectionMatrix",&local_271);
        vera::getProjectionViewWorldMatrix();
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                 ::operator->(&local_200);
        iVar3 = (*(ppVar6->second->super_Node)._vptr_Node[0x20])();
        glm::operator*(&local_2b4,&local_2f4,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar3));
        vera::Shader::setUniform(pSVar1,&local_270,&local_2b4,false);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
        pSVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_318,"u_model",&local_319);
        pvVar5 = vera::Node::getPosition(&this->m_origin);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                 ::operator->(&local_200);
        iVar3 = (*(ppVar6->second->super_Node)._vptr_Node[0x13])();
        vVar8 = glm::operator+(pvVar5,(vec<3,_float,_(glm::qualifier)0> *)
                                      CONCAT44(extraout_var_00,iVar3));
        local_338.field_2 = vVar8.field_2;
        local_338._0_8_ = vVar8._0_8_;
        local_328._0_8_ = local_338._0_8_;
        local_328.field_2 = local_338.field_2;
        vera::Shader::setUniform(pSVar1,&local_318,&local_328);
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        pSVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_358,"u_modelMatrix",&local_359);
        pmVar4 = vera::Node::getTransformMatrix(&this->m_origin);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                 ::operator->(&local_200);
        iVar3 = (*(ppVar6->second->super_Node)._vptr_Node[0x20])();
        glm::operator*(&local_39c,pmVar4,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var_01,iVar3));
        vera::Shader::setUniform(pSVar1,&local_358,&local_39c,false);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator((allocator<char> *)&local_359);
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                 ::operator->(&local_200);
        vera::Model::render(ppVar6->second,local_20);
        bVar2 = Tracker::isRunning((Tracker *)((long)&normalShader[3].m_vertexSource.field_2 + 8));
        if (bVar2) {
          pSVar1 = normalShader + 3;
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
                   ::operator->(&local_200);
          psVar7 = vera::Model::getName_abi_cxx11_(ppVar6->second);
          std::operator+(&local_3c0,"render:sceneNormal:",psVar7);
          Tracker::end((Tracker *)((long)&(pSVar1->m_vertexSource).field_2 + 8),&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
      ::operator++(&local_200);
    }
    if ((this->m_depth_test & 1U) != 0) {
      glDisable(0xb71);
    }
    if (this->m_culling != CULL_NONE) {
      glDisable(0xb44);
    }
    vera::Fbo::unbind(&this->normalFbo);
  }
  return;
}

Assistant:

void SceneRender::renderNormalBuffer(Uniforms& _uniforms) {
    if (!normalFbo.isAllocated())
        return;

    normalFbo.bind();

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    vera::Shader* normalShader = nullptr;
    if (m_floor_subd_target >= 0) {
        normalShader = m_floor.getBufferShader("normal");
        if (normalShader != nullptr) {
            TRACK_BEGIN("render:sceneNormal:floor")
            normalShader->use();
            _uniforms.feedTo( normalShader, false );
            normalShader->setUniform("u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * m_floor.getTransformMatrix());
            normalShader->setUniform("u_model", m_origin.getPosition() + m_floor.getPosition() );
            normalShader->setUniform("u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
            m_floor.render(normalShader);
            TRACK_END("render:sceneNormal:floor")
        } 
    }

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        normalShader = it->second->getBufferShader("normal");
        if (normalShader != nullptr) {
            TRACK_BEGIN("render:sceneNormal:" + it->second->getName() )

            // bind the shader
            normalShader->use();

            // Update Uniforms and textures variables to the shader
            _uniforms.feedTo( normalShader, false );

            // Pass special uniforms
            normalShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix());
            normalShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
            normalShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
            it->second->render(normalShader);

            TRACK_END("render:sceneNormal:" + it->second->getName() )
        }
    }

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);

    normalFbo.unbind();
}